

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O1

void ExtractAnimationData
               (Asset *mAsset,string *animId,Ref<glTF::Animation> *animRef,Ref<glTF::Buffer> *buffer
               ,aiNodeAnim *nodeChannel,float ticksPerSecond)

{
  uint uVar1;
  Animation *pAVar2;
  aiVectorKey *paVar3;
  aiQuatKey *paVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 *puVar7;
  void *data;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  undefined8 *puVar13;
  ulong uVar14;
  uint count;
  ulong __new_size;
  Ref<glTF::Accessor> RVar15;
  vector<float,_std::allocator<float>_> timeData;
  size_t counts [3];
  
  counts[0] = (ulong)nodeChannel->mNumPositionKeys;
  counts[1] = (ulong)nodeChannel->mNumScalingKeys;
  counts[2] = (ulong)nodeChannel->mNumRotationKeys;
  lVar9 = 0;
  __new_size = 1;
  do {
    uVar14 = __new_size;
    uVar8 = counts[lVar9];
    __new_size = uVar14;
    if (uVar14 < uVar8) {
      __new_size = uVar8;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  count = (uint)__new_size;
  if (nodeChannel->mNumPositionKeys != 0) {
    timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize(&timeData,__new_size);
    uVar11 = uVar14;
    if (uVar14 < uVar8) {
      uVar11 = uVar8;
    }
    uVar10 = 0;
    do {
      timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10] =
           (float)(nodeChannel->mPositionKeys[(nodeChannel->mNumPositionKeys * uVar10) / __new_size]
                   .mTime / (double)ticksPerSecond);
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    RVar15 = ExportData(mAsset,animId,buffer,count,
                        timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,SCALAR,SCALAR,ComponentType_FLOAT,false);
    if (RVar15.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      pAVar2 = (animRef->vector->
               super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>)._M_impl.
               super__Vector_impl_data._M_start[animRef->index];
      (pAVar2->Parameters).TIME.vector = RVar15.vector;
      *(uint *)((long)&(pAVar2->Parameters).TIME + 8) = RVar15.index;
    }
    if (timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(timeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  uVar1 = nodeChannel->mNumPositionKeys;
  if ((ulong)uVar1 != 0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = __new_size;
    uVar11 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0xc),8) == 0) {
      uVar11 = SUB168(auVar5 * ZEXT816(0xc),0);
    }
    puVar7 = (undefined8 *)operator_new__(uVar11);
    uVar10 = 0;
    memset(puVar7,0,((__new_size * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    paVar3 = nodeChannel->mPositionKeys;
    uVar11 = uVar14;
    puVar13 = puVar7;
    if (uVar14 < uVar8) {
      uVar11 = uVar8;
    }
    do {
      *(float *)(puVar13 + 1) = paVar3[uVar10 / __new_size].mValue.z;
      *puVar13 = *(undefined8 *)&paVar3[uVar10 / __new_size].mValue;
      uVar10 = uVar10 + uVar1;
      uVar11 = uVar11 - 1;
      puVar13 = (undefined8 *)((long)puVar13 + 0xc);
    } while (uVar11 != 0);
    RVar15 = ExportData(mAsset,animId,buffer,count,puVar7,VEC3,VEC3,ComponentType_FLOAT,false);
    if (RVar15.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      pAVar2 = (animRef->vector->
               super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>)._M_impl.
               super__Vector_impl_data._M_start[animRef->index];
      (pAVar2->Parameters).translation.vector = RVar15.vector;
      *(uint *)((long)&(pAVar2->Parameters).translation + 8) = RVar15.index;
    }
    operator_delete__(puVar7);
  }
  uVar1 = nodeChannel->mNumScalingKeys;
  if ((ulong)uVar1 != 0) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = __new_size;
    uVar11 = 0xffffffffffffffff;
    if (SUB168(auVar6 * ZEXT816(0xc),8) == 0) {
      uVar11 = SUB168(auVar6 * ZEXT816(0xc),0);
    }
    puVar7 = (undefined8 *)operator_new__(uVar11);
    uVar10 = 0;
    memset(puVar7,0,((__new_size * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    paVar3 = nodeChannel->mScalingKeys;
    uVar11 = uVar14;
    puVar13 = puVar7;
    if (uVar14 < uVar8) {
      uVar11 = uVar8;
    }
    do {
      *(float *)(puVar13 + 1) = paVar3[uVar10 / __new_size].mValue.z;
      *puVar13 = *(undefined8 *)&paVar3[uVar10 / __new_size].mValue;
      uVar10 = uVar10 + uVar1;
      uVar11 = uVar11 - 1;
      puVar13 = (undefined8 *)((long)puVar13 + 0xc);
    } while (uVar11 != 0);
    RVar15 = ExportData(mAsset,animId,buffer,count,puVar7,VEC3,VEC3,ComponentType_FLOAT,false);
    if (RVar15.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      pAVar2 = (animRef->vector->
               super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>)._M_impl.
               super__Vector_impl_data._M_start[animRef->index];
      (pAVar2->Parameters).scale.vector = RVar15.vector;
      *(uint *)((long)&(pAVar2->Parameters).scale + 8) = RVar15.index;
    }
    operator_delete__(puVar7);
  }
  uVar1 = nodeChannel->mNumRotationKeys;
  if ((ulong)uVar1 != 0) {
    uVar11 = 0;
    data = operator_new__(-(ulong)(__new_size >> 0x3c != 0) | __new_size << 4);
    if (uVar14 < uVar8) {
      uVar14 = uVar8;
    }
    paVar4 = nodeChannel->mRotationKeys;
    pfVar12 = (float *)((long)data + 0xc);
    do {
      uVar8 = uVar11 / __new_size;
      pfVar12[-3] = paVar4[uVar8].mValue.x;
      pfVar12[-2] = paVar4[uVar8].mValue.y;
      pfVar12[-1] = paVar4[uVar8].mValue.z;
      *pfVar12 = paVar4[uVar8].mValue.w;
      pfVar12 = pfVar12 + 4;
      uVar11 = uVar11 + uVar1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
    RVar15 = ExportData(mAsset,animId,buffer,count,data,VEC4,VEC4,ComponentType_FLOAT,false);
    if (RVar15.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      pAVar2 = (animRef->vector->
               super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>)._M_impl.
               super__Vector_impl_data._M_start[animRef->index];
      (pAVar2->Parameters).rotation.vector = RVar15.vector;
      *(uint *)((long)&(pAVar2->Parameters).rotation + 8) = RVar15.index;
    }
    operator_delete__(data);
  }
  return;
}

Assistant:

inline void ExtractAnimationData(Asset& mAsset, std::string& animId, Ref<Animation>& animRef, Ref<Buffer>& buffer, const aiNodeAnim* nodeChannel, float ticksPerSecond)
{
    // Loop over the data and check to see if it exactly matches an existing buffer.
    //    If yes, then reference the existing corresponding accessor.
    //    Otherwise, add to the buffer and create a new accessor.

    size_t counts[3] = {
        nodeChannel->mNumPositionKeys,
        nodeChannel->mNumScalingKeys,
        nodeChannel->mNumRotationKeys,
    };
    size_t numKeyframes = 1;
    for (int i = 0; i < 3; ++i) {
        if (counts[i] > numKeyframes) {
            numKeyframes = counts[i];
        }
    }

    //-------------------------------------------------------
    // Extract TIME parameter data.
    // Check if the timeStamps are the same for mPositionKeys, mRotationKeys, and mScalingKeys.
    if(nodeChannel->mNumPositionKeys > 0) {
        typedef float TimeType;
        std::vector<TimeType> timeData;
        timeData.resize(numKeyframes);
        for (size_t i = 0; i < numKeyframes; ++i) {
            size_t frameIndex = i * nodeChannel->mNumPositionKeys / numKeyframes;
            // mTime is measured in ticks, but GLTF time is measured in seconds, so convert.
            // Check if we have to cast type here. e.g. uint16_t()
            timeData[i] = static_cast<float>(nodeChannel->mPositionKeys[frameIndex].mTime / ticksPerSecond);
        }

        Ref<Accessor> timeAccessor = ExportData(mAsset, animId, buffer, static_cast<unsigned int>(numKeyframes), &timeData[0], AttribType::SCALAR, AttribType::SCALAR, ComponentType_FLOAT);
        if (timeAccessor) animRef->Parameters.TIME = timeAccessor;
    }

    //-------------------------------------------------------
    // Extract translation parameter data
    if(nodeChannel->mNumPositionKeys > 0) {
        C_STRUCT aiVector3D* translationData = new aiVector3D[numKeyframes];
        for (size_t i = 0; i < numKeyframes; ++i) {
            size_t frameIndex = i * nodeChannel->mNumPositionKeys / numKeyframes;
            translationData[i] = nodeChannel->mPositionKeys[frameIndex].mValue;
        }

        Ref<Accessor> tranAccessor = ExportData(mAsset, animId, buffer, static_cast<unsigned int>(numKeyframes), translationData, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
        if ( tranAccessor ) {
            animRef->Parameters.translation = tranAccessor;
        }
        delete[] translationData;
    }

    //-------------------------------------------------------
    // Extract scale parameter data
    if(nodeChannel->mNumScalingKeys > 0) {
        C_STRUCT aiVector3D* scaleData = new aiVector3D[numKeyframes];
        for (size_t i = 0; i < numKeyframes; ++i) {
            size_t frameIndex = i * nodeChannel->mNumScalingKeys / numKeyframes;
            scaleData[i] = nodeChannel->mScalingKeys[frameIndex].mValue;
        }

        Ref<Accessor> scaleAccessor = ExportData(mAsset, animId, buffer, static_cast<unsigned int>(numKeyframes), scaleData, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
        if ( scaleAccessor ) {
            animRef->Parameters.scale = scaleAccessor;
        }
        delete[] scaleData;
    }

    //-------------------------------------------------------
    // Extract rotation parameter data
    if(nodeChannel->mNumRotationKeys > 0) {
        vec4* rotationData = new vec4[numKeyframes];
        for (size_t i = 0; i < numKeyframes; ++i) {
            size_t frameIndex = i * nodeChannel->mNumRotationKeys / numKeyframes;
            rotationData[i][0] = nodeChannel->mRotationKeys[frameIndex].mValue.x;
            rotationData[i][1] = nodeChannel->mRotationKeys[frameIndex].mValue.y;
            rotationData[i][2] = nodeChannel->mRotationKeys[frameIndex].mValue.z;
            rotationData[i][3] = nodeChannel->mRotationKeys[frameIndex].mValue.w;
        }

        Ref<Accessor> rotAccessor = ExportData(mAsset, animId, buffer, static_cast<unsigned int>(numKeyframes), rotationData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
        if ( rotAccessor ) {
            animRef->Parameters.rotation = rotAccessor;
        }
        delete[] rotationData;
    }
}